

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_New_Internal
                   (FT_Memory memory,FT_UInt numPoints,FT_Int numContours,FT_Outline *anoutline)

{
  FT_Vector *pFVar1;
  char *pcVar2;
  short *psVar3;
  int local_2c;
  FT_Outline *pFStack_28;
  FT_Error error;
  FT_Outline *anoutline_local;
  FT_Int numContours_local;
  FT_UInt numPoints_local;
  FT_Memory memory_local;
  
  if ((anoutline == (FT_Outline *)0x0) || (memory == (FT_Memory)0x0)) {
    memory_local._4_4_ = 6;
  }
  else {
    pFStack_28 = anoutline;
    anoutline_local._0_4_ = numContours;
    anoutline_local._4_4_ = numPoints;
    _numContours_local = memory;
    memcpy(anoutline,&null_outline,0x28);
    if (((int)(uint)anoutline_local < 0) || (anoutline_local._4_4_ < (uint)anoutline_local)) {
      memory_local._4_4_ = 6;
    }
    else if (anoutline_local._4_4_ < 0x8000) {
      pFVar1 = (FT_Vector *)
               ft_mem_realloc(_numContours_local,0x10,0,(ulong)anoutline_local._4_4_,(void *)0x0,
                              &local_2c);
      pFStack_28->points = pFVar1;
      if (local_2c == 0) {
        pcVar2 = (char *)ft_mem_realloc(_numContours_local,1,0,(ulong)anoutline_local._4_4_,
                                        (void *)0x0,&local_2c);
        pFStack_28->tags = pcVar2;
        if (local_2c == 0) {
          psVar3 = (short *)ft_mem_realloc(_numContours_local,2,0,(long)(int)(uint)anoutline_local,
                                           (void *)0x0,&local_2c);
          pFStack_28->contours = psVar3;
          if (local_2c == 0) {
            pFStack_28->n_points = (short)anoutline_local._4_4_;
            pFStack_28->n_contours = (short)(uint)anoutline_local;
            pFStack_28->flags = pFStack_28->flags | 1;
            return 0;
          }
        }
      }
      pFStack_28->flags = pFStack_28->flags | 1;
      FT_Outline_Done_Internal(_numContours_local,pFStack_28);
      memory_local._4_4_ = local_2c;
    }
    else {
      memory_local._4_4_ = 10;
    }
  }
  return memory_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_New_Internal( FT_Memory    memory,
                           FT_UInt      numPoints,
                           FT_Int       numContours,
                           FT_Outline  *anoutline )
  {
    FT_Error  error;


    if ( !anoutline || !memory )
      return FT_THROW( Invalid_Argument );

    *anoutline = null_outline;

    if ( numContours < 0                  ||
         (FT_UInt)numContours > numPoints )
      return FT_THROW( Invalid_Argument );

    if ( numPoints > FT_OUTLINE_POINTS_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_NEW_ARRAY( anoutline->points,   numPoints   ) ||
         FT_NEW_ARRAY( anoutline->tags,     numPoints   ) ||
         FT_NEW_ARRAY( anoutline->contours, numContours ) )
      goto Fail;

    anoutline->n_points    = (FT_Short)numPoints;
    anoutline->n_contours  = (FT_Short)numContours;
    anoutline->flags      |= FT_OUTLINE_OWNER;

    return FT_Err_Ok;

  Fail:
    anoutline->flags |= FT_OUTLINE_OWNER;
    FT_Outline_Done_Internal( memory, anoutline );

    return error;
  }